

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

void __thiscall
cs_impl::
cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
::cni_holder(cni_holder<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
             *this,_func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char
                   **func)

{
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  *in_RDI;
  cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  *this_00;
  function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  *in_stack_ffffffffffffffc0;
  _func_void_shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_ptr_char *local_30 [6];
  
  cni_holder_base::cni_holder_base((cni_holder_base *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__cni_holder_003e3388;
  this_00 = (cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
             *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
  std::function<void(std::shared_ptr<std::ostream>&,char)>::
  function<void(*const&)(std::shared_ptr<std::ostream>&,char),void>
            (in_stack_ffffffffffffffc0,local_30);
  cni_helper<void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char),_void_(*)(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  ::cni_helper(this_00,in_RDI);
  std::function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
  ::~function((function<void_(std::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>_&,_char)>
               *)0x2c0886);
  return;
}

Assistant:

explicit cni_holder(const T &func) : mCni(func) {}